

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3phseg_io.c
# Opt level: O3

int s3phseg_read(char *fn,acmod_set_t *acmod_set,s3phseg_t **out_phseg)

{
  s3phseg_s *psVar1;
  int iVar2;
  acmod_id_t id;
  uint32 uVar3;
  acmod_id_t aVar4;
  FILE *__stream;
  size_t sVar5;
  char *pcVar6;
  s3phseg_t *ptr;
  s3phseg_s *psVar7;
  s3phseg_t *psVar8;
  int score;
  uint ef;
  uint sf;
  char txt [512];
  acmod_id_t local_24c;
  uint32 local_248;
  uint32 local_244;
  undefined8 local_240;
  int local_238;
  short local_234;
  
  __stream = fopen(fn,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
            ,0x40,"Failed to open phseg file %s\n",fn);
    return -1;
  }
  do {
    iVar2 = __isoc99_fscanf(__stream,"%511s",&local_238);
    if (iVar2 == 0) break;
    if (iVar2 == -1) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
              ,0x46,"Failed to read column headers from phseg file\n");
      goto LAB_0011faa1;
    }
  } while (local_234 != 0x65 || local_238 != 0x6e6f6850);
  iVar2 = feof(__stream);
  if (iVar2 == 0) {
    psVar8 = (s3phseg_t *)0x0;
    local_240 = out_phseg;
    do {
      iVar2 = __isoc99_fscanf(__stream,"%u %u %d",&local_244,&local_248,&local_24c);
      ptr = psVar8;
      if (iVar2 < 3) break;
      fgets((char *)&local_238,0x200,__stream);
      sVar5 = strlen((char *)&local_238);
      if (*(char *)((long)&local_238 + (sVar5 - 1)) == '\n') {
        *(undefined1 *)((long)&local_240 + sVar5 + 7) = 0;
      }
      sVar5 = strspn((char *)&local_238," \t");
      pcVar6 = strchr((char *)((long)&local_238 + sVar5),0x20);
      if (pcVar6 == (char *)0x0) {
        id = acmod_set_name2id(acmod_set,(char *)&local_238);
        if (id == 0xffffffff) {
LAB_0011fc5c:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                  ,0x60,"Unknown CI phone (%s) in phseg file\n",&local_238);
LAB_0011faa1:
          fclose(__stream);
          return -1;
        }
      }
      else {
        *pcVar6 = '\0';
        id = acmod_set_name2id(acmod_set,(char *)&local_238);
        if (id == 0xffffffff) goto LAB_0011fc5c;
        *pcVar6 = ' ';
      }
      aVar4 = id;
      if (((acmod_set->n_multi != 0) &&
          (uVar3 = acmod_set_has_attrib(acmod_set,id,"filler"), uVar3 == 0)) &&
         (aVar4 = acmod_set_name2id(acmod_set,(char *)&local_238), aVar4 == 0xffffffff)) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                ,0x69,"Unknown triphone (%s) in phseg file\n",&local_238);
        aVar4 = id;
      }
      ptr = (s3phseg_t *)
            __ckd_calloc__(1,0x20,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                           ,0x6e);
      ptr->next = psVar8;
      ptr->phone = aVar4;
      ptr->sf = local_244;
      ptr->ef = local_248;
      ptr->score = local_24c;
      iVar2 = feof(__stream);
      psVar8 = ptr;
    } while (iVar2 == 0);
    fclose(__stream);
    if (local_240 == (s3phseg_t **)0x0) {
      local_240 = (s3phseg_t **)0x0;
      while (ptr != (s3phseg_t *)0x0) {
        psVar7 = ptr->next;
        ckd_free(ptr);
        ptr = psVar7;
      }
      return 0;
    }
    if (ptr != (s3phseg_t *)0x0) {
      psVar7 = (s3phseg_s *)0x0;
      do {
        psVar1 = ptr->next;
        *local_240 = ptr;
        ptr->next = psVar7;
        psVar7 = *local_240;
        ptr = psVar1;
      } while (psVar1 != (s3phseg_s *)0x0);
      return 0;
    }
  }
  else {
    fclose(__stream);
  }
  return 0;
}

Assistant:

int
s3phseg_read(const char *fn,
	     acmod_set_t *acmod_set,
	     s3phseg_t **out_phseg)
{
	FILE *fp;
	char txt[512];
	s3phseg_t *plist = NULL;
	int n;

	if ((fp = fopen(fn, "r")) == NULL) {
		E_ERROR("Failed to open phseg file %s\n", fn);
		return S3_ERROR;
	}
	/* Should be a header of column names */
	while ((n = fscanf(fp, "%511s", txt))) {
		if (n == EOF) {
			E_ERROR("Failed to read column headers from phseg file\n");
			goto error_out;
		}
		if (!strcmp(txt, "Phone"))
			break;
	}
	/* Get each line */
	while (!feof(fp)) {
		unsigned int sf, ef;
		int score;
		acmod_id_t ci, phone;
		s3phseg_t *phseg;
		char *c, *cc;

		n = fscanf(fp, "%u %u %d", &sf, &ef, &score);
		if (n < 3) /* We probably hit EOF or "Total score" */
			break;
		fgets(txt, sizeof(txt), fp);
		/* Remove newline. */
		if (txt[strlen(txt)-1] == '\n')
			txt[strlen(txt)-1] = '\0';
		/* Find the base phone. */
		cc = txt + strspn(txt, " \t");
		if ((c = strchr(cc, ' ')))
			*c = '\0';
		if ((ci = phone = acmod_set_name2id(acmod_set, txt)) == NO_ACMOD) {
			E_ERROR("Unknown CI phone (%s) in phseg file\n", txt);
			goto error_out;
		}
		/* Restore the space and find the triphone if necessary. */
		if (c) *c = ' ';
		if (acmod_set->n_multi != 0
		    && !acmod_set_has_attrib(acmod_set, phone, "filler")) {
			if ((phone = acmod_set_name2id(acmod_set, txt)) == NO_ACMOD) {
				/* This might be too verbose. */
				E_WARN("Unknown triphone (%s) in phseg file\n", txt);
				/* Back off to CI phone. */
				phone = ci;
			}
		}
		phseg = ckd_calloc(1, sizeof(*phseg));
		phseg->next = plist;
		phseg->phone = phone;
		phseg->sf = sf;
		phseg->ef = ef;
		phseg->score = score;
		plist = phseg;
	}
	fclose(fp);
	if (out_phseg) {
		s3phseg_t *next, *last = NULL;
		/* Now reverse the list. */
		while (plist) {
			next = plist->next;
			*out_phseg = plist;
			(*out_phseg)->next = last;
			last = *out_phseg;
			plist = next;
		}
	}
	else
		s3phseg_free(plist);
	return S3_SUCCESS;
error_out:
	fclose(fp);
	return S3_ERROR;
}